

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.cpp
# Opt level: O2

void __thiscall slang::IntervalMapDetails::Path::moveLeft(Path *this,uint32_t level)

{
  size_type sVar1;
  pointer pEVar2;
  ulong uVar3;
  uint uVar4;
  ulong *puVar5;
  uint uVar6;
  void *pvVar7;
  uint uVar8;
  ulong uVar9;
  Entry local_28;
  
  uVar3 = (ulong)level;
  sVar1 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  if ((sVar1 == 0) ||
     (pEVar2 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     uVar9 = uVar3, pEVar2->size <= pEVar2->offset)) {
    uVar9 = 0;
    if ((int)sVar1 - 1U < level) {
      local_28.node = (void *)0x0;
      local_28.size = 0;
      local_28.offset = 0;
      SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
      resizeImpl<slang::IntervalMapDetails::Path::Entry>
                ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this,(ulong)(level + 1),
                 &local_28);
    }
  }
  else {
    do {
      uVar9 = (ulong)((int)uVar9 - 1);
    } while (pEVar2[uVar9].offset == 0);
  }
  pEVar2 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar4 = pEVar2[uVar9].offset - 1;
  pEVar2[uVar9].offset = uVar4;
  puVar5 = (ulong *)((ulong)uVar4 * 8 + (long)pEVar2[uVar9].node);
  while( true ) {
    uVar8 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar8;
    uVar6 = (uint)*puVar5;
    uVar4 = uVar6 & 0x3f;
    pvVar7 = (void *)(*puVar5 & 0xffffffffffffffc0);
    pEVar2 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    if (level == uVar8) break;
    pEVar2[uVar8].node = pvVar7;
    pEVar2[uVar8].size = uVar4 + 1;
    pEVar2[uVar8].offset = uVar4;
    puVar5 = (ulong *)((long)pvVar7 + (ulong)(uVar6 & 0x3f) * 8);
  }
  pEVar2[uVar3].node = pvVar7;
  pEVar2[uVar3].size = uVar4 + 1;
  pEVar2[uVar3].offset = uVar4;
  return;
}

Assistant:

void Path::moveLeft(uint32_t level) {
    SLANG_ASSERT(level);

    // Go up the tree until we find a node where we can go left.
    uint32_t l = 0;
    if (valid()) {
        l = level - 1;
        while (path[l].offset == 0) {
            SLANG_ASSERT(l);
            --l;
        }
    }
    else if (height() < level) {
        path.resize(level + 1, Entry(nullptr, 0, 0));
    }

    --path[l].offset;

    // Get the rightmost node of the new subtree.
    NodeRef nodeRef = childAt(l);
    for (++l; l != level; ++l) {
        path[l] = Entry(nodeRef, nodeRef.size() - 1);
        nodeRef = nodeRef.childAt(nodeRef.size() - 1);
    }
    path[l] = Entry(nodeRef, nodeRef.size() - 1);
}